

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.cpp
# Opt level: O0

int reader(UI *ui,UI_STRING *uis)

{
  int iVar1;
  undefined8 *in_RDX;
  size_t *size_local;
  void *ud_local;
  lua_State *L_local;
  
  iVar1 = *(int *)uis;
  *(int *)uis = iVar1 + -1;
  if (iVar1 == 0) {
    *in_RDX = 0;
    L_local._0_4_ = 0;
  }
  else {
    *in_RDX = 0x12;
    L_local._0_4_ = 0x12344a;
  }
  return (int)L_local;
}

Assistant:

static const char* reader(lua_State *L, void *ud, size_t *size)
{
 UNUSED(L);
 if ((*(int*)ud)--)
 {
  *size=sizeof(FUNCTION)-1;
  return FUNCTION;
 }
 else
 {
  *size=0;
  return NULL;
 }
}